

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O1

TempBufferPoolReservation * __thiscall
duckdb::StandardBufferManager::
EvictBlocksOrThrow<char_const*,std::__cxx11::string,std::__cxx11::string>
          (TempBufferPoolReservation *__return_storage_ptr__,StandardBufferManager *this,
          MemoryTag tag,idx_t memory_delta,
          unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *buffer,
          char *args,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  BufferPool *pBVar1;
  pointer pcVar2;
  StringUtil *pSVar3;
  OutOfMemoryException *this_00;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  string extra_text;
  EvictionResult r;
  allocator local_151;
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  char local_50 [8];
  BufferPoolReservation local_48;
  
  pBVar1 = this->buffer_pool;
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (pBVar1->maximum_memory).super___atomic_base<unsigned_long>._M_i;
  (*pBVar1->_vptr_BufferPool[3])
            (local_50,pBVar1,CONCAT71(in_register_00000011,tag),memory_delta,params_1,buffer);
  if (local_50[0] != '\0') {
    BufferPoolReservation::BufferPoolReservation
              (&__return_storage_ptr__->super_BufferPoolReservation,&local_48);
    TempBufferPoolReservation::~TempBufferPoolReservation((TempBufferPoolReservation *)&local_48);
    return __return_storage_ptr__;
  }
  local_150[0] = local_140;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_150," (%s/%s used)","");
  pSVar3 = (StringUtil *)BufferPool::GetUsedMemory(this->buffer_pool,true);
  StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_90,pSVar3,0x400,memory_delta);
  pSVar3 = (StringUtil *)BufferPool::GetMaxMemory(this->buffer_pool);
  StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_b0,pSVar3,0x400,memory_delta);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (&local_130,(StringUtil *)local_150,(string *)&local_90,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0,params_1
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_150[0] != local_140) {
    operator_delete(local_150[0]);
  }
  ::std::__cxx11::string::append((char *)&local_130);
  this_00 = (OutOfMemoryException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_70,args,&local_151);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  pcVar2 = (args_1->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar2,pcVar2 + args_1->_M_string_length);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  pcVar2 = (args_2->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar2,pcVar2 + args_2->_M_string_length);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,local_130._M_dataplus._M_p,
             local_130._M_dataplus._M_p + local_130._M_string_length);
  OutOfMemoryException::
  OutOfMemoryException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this_00,&local_70,&local_d0,&local_f0,&local_110);
  __cxa_throw(this_00,&OutOfMemoryException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TempBufferPoolReservation StandardBufferManager::EvictBlocksOrThrow(MemoryTag tag, idx_t memory_delta,
                                                                    unique_ptr<FileBuffer> *buffer, ARGS... args) {
	auto r = buffer_pool.EvictBlocks(tag, memory_delta, buffer_pool.maximum_memory, buffer);
	if (!r.success) {
		string extra_text = StringUtil::Format(" (%s/%s used)", StringUtil::BytesToHumanReadableString(GetUsedMemory()),
		                                       StringUtil::BytesToHumanReadableString(GetMaxMemory()));
		extra_text += InMemoryWarning();
		throw OutOfMemoryException(args..., extra_text);
	}
	return std::move(r.reservation);
}